

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O1

LIBSSH2_CHANNEL * scp_recv(LIBSSH2_SESSION *session,char *path,libssh2_struct_stat *sb)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uchar *puVar5;
  LIBSSH2_CHANNEL *pLVar6;
  ssize_t sVar7;
  long lVar8;
  char *pcVar9;
  longlong lVar10;
  uint uVar11;
  undefined8 uVar12;
  char *pcVar13;
  ulong uVar14;
  uchar *puVar15;
  size_t sVar16;
  char *e;
  char *local_40;
  uchar *local_38;
  
  if (session->scpRecv_state == libssh2_NB_state_idle) {
    session->scpRecv_mtime = 0;
    session->scpRecv_atime = 0;
    session->scpRecv_mode = 0;
    session->scpRecv_size = 0;
    sVar4 = strlen(path);
    sVar16 = (0xb - (ulong)(sb == (libssh2_struct_stat *)0x0)) + sVar4 * 3;
    session->scpRecv_command_len = sVar16;
    puVar5 = (uchar *)(*session->alloc)(sVar16,&session->abstract);
    session->scpRecv_command = puVar5;
    if (puVar5 == (uchar *)0x0) {
      pcVar13 = "Unable to allocate a command buffer for SCP session";
      iVar2 = -6;
      goto LAB_00122162;
    }
    snprintf((char *)puVar5,session->scpRecv_command_len,"scp -%sf ");
    puVar5 = session->scpRecv_command;
    sVar4 = strlen((char *)puVar5);
    if ((session->flag).quote_paths == 0) {
      sVar16 = strlen(path);
      memcpy(puVar5 + sVar4,path,sVar16);
    }
    else {
      sVar16 = shell_quotearg(path,puVar5 + sVar4,session->scpRecv_command_len - sVar4);
    }
    session->scpRecv_command_len = sVar16 + sVar4;
    session->scpRecv_state = libssh2_NB_state_created;
  }
  if (session->scpRecv_state != libssh2_NB_state_created) {
LAB_00122096:
    if (session->scpRecv_state == libssh2_NB_state_sent) {
      iVar2 = _libssh2_channel_process_startup
                        (session->scpRecv_channel,"exec",4,(char *)session->scpRecv_command,
                         session->scpRecv_command_len);
      if (iVar2 != 0) {
        if (iVar2 != -0x25) {
          (*session->free)(session->scpRecv_command,&session->abstract);
          session->scpRecv_command = (uchar *)0x0;
          goto switchD_00122592_caseD_4;
        }
        pcVar13 = "Would block requesting SCP startup";
        goto LAB_0012215a;
      }
      (*session->free)(session->scpRecv_command,&session->abstract);
      session->scpRecv_command = (uchar *)0x0;
      session->scpRecv_response[0] = '\0';
      session->scpRecv_state = libssh2_NB_state_sent1;
    }
    if (session->scpRecv_state == libssh2_NB_state_sent1) {
      sVar7 = _libssh2_channel_write(session->scpRecv_channel,0,session->scpRecv_response,1);
      if ((int)sVar7 != 1) {
        if ((int)sVar7 != -0x25) goto switchD_00122592_caseD_4;
        pcVar13 = "Would block sending initial wakeup";
        goto LAB_0012215a;
      }
      session->scpRecv_response_len = 0;
      session->scpRecv_state = libssh2_NB_state_sent2;
    }
    if (session->scpRecv_state - libssh2_NB_state_sent2 < 2) {
      if (sb != (libssh2_struct_stat *)0x0) {
        puVar5 = session->scpRecv_response;
        puVar15 = session->scpRecv_response + 1;
LAB_0012222e:
        if (session->scpRecv_response_len < 0x100) {
          if (session->scpRecv_state == libssh2_NB_state_sent2) {
            sVar7 = _libssh2_channel_read
                              (session->scpRecv_channel,0,
                               (char *)(puVar5 + session->scpRecv_response_len),1);
            iVar2 = (int)sVar7;
            if (iVar2 == -0x25) {
              pcVar13 = "Would block waiting for SCP response";
LAB_0012256e:
              _libssh2_error(session,-0x25,pcVar13);
              uVar12 = 1;
            }
            else if (iVar2 < 0) {
              pcVar13 = "Failed reading SCP response";
LAB_00122324:
              _libssh2_error(session,iVar2,pcVar13);
              uVar12 = 4;
            }
            else if (iVar2 == 0) {
              uVar12 = 9;
            }
            else {
              sVar16 = session->scpRecv_response_len;
              uVar14 = sVar16 + 1;
              session->scpRecv_response_len = uVar14;
              if (session->scpRecv_response[0] == 'T') {
                if (((uVar14 < 2) || (bVar1 = puVar5[sVar16], 0xf5 < (byte)(bVar1 - 0x3a))) ||
                   ((bVar1 < 0x21 && ((0x100002400U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)))) {
                  if ((uVar14 < 9) || (puVar5[sVar16] != '\n')) {
                    uVar12 = 7;
                    if (uVar14 != 0x100) goto LAB_0012257f;
                    iVar2 = -0x1c;
                    pcVar13 = "Unterminated response from SCP server";
                  }
                  else {
                    sVar16 = session->scpRecv_response_len;
                    while( true ) {
                      if ((session->scpRecv_response[sVar16 - 1] != '\r') &&
                         (session->scpRecv_response[sVar16 - 1] != '\n')) break;
                      session->scpRecv_response_len = sVar16 - 1;
                      sVar16 = sVar16 - 1;
                    }
                    session->scpRecv_response[sVar16] = '\0';
                    if (session->scpRecv_response_len < 8) {
                      iVar2 = -0x1c;
                      pcVar13 = "Invalid response from SCP server, too short";
                    }
                    else {
                      pcVar13 = strchr((char *)puVar15,0x20);
                      if (pcVar13 != (char *)0x0 &&
                          ((uchar *)pcVar13 != puVar15 && -1 < (long)pcVar13 - (long)puVar15)) {
                        *pcVar13 = '\0';
                        lVar8 = strtol((char *)puVar15,(char **)0x0,10);
                        session->scpRecv_mtime = lVar8;
                        pcVar9 = strchr(pcVar13 + 1,0x20);
                        if (pcVar9 == (char *)0x0 || (long)pcVar9 - (long)(pcVar13 + 1) < 1) {
                          pcVar13 = "Invalid response from SCP server, malformed mtime.usec";
                        }
                        else {
                          pcVar9 = pcVar9 + 1;
                          pcVar13 = strchr(pcVar9,0x20);
                          if (pcVar13 != (char *)0x0 &&
                              (pcVar13 != pcVar9 && -1 < (long)pcVar13 - (long)pcVar9)) {
                            *pcVar13 = '\0';
                            lVar8 = strtol(pcVar9,(char **)0x0,10);
                            session->scpRecv_atime = lVar8;
                            session->scpRecv_response[0] = '\0';
                            session->scpRecv_state = libssh2_NB_state_sent3;
                            goto LAB_0012252f;
                          }
                          pcVar13 = "Invalid response from SCP server, too short or malformed";
                        }
                        _libssh2_error(session,-0x1c,pcVar13);
                        goto LAB_001223e1;
                      }
                      iVar2 = -0x1c;
                      pcVar13 = "Invalid response from SCP server, malformed mtime";
                    }
                  }
                }
                else {
                  iVar2 = -0x1c;
                  pcVar13 = "Invalid data in SCP response";
                }
                goto LAB_00122324;
              }
              local_38 = puVar15;
              sVar16 = _libssh2_channel_packet_data_len(session->scpRecv_channel,0);
              pcVar13 = (char *)(*session->alloc)(sVar16 + 1,&session->abstract);
              if (pcVar13 == (char *)0x0) {
                _libssh2_error(session,-6,"Failed to get memory ");
                puVar15 = local_38;
              }
              else {
                _libssh2_channel_read(session->scpRecv_channel,0,pcVar13,sVar16);
                pcVar13[sVar16] = '\0';
                _libssh2_error(session,-0x1c,"Failed to recv file");
                (*session->free)(pcVar13,&session->abstract);
                puVar15 = local_38;
              }
LAB_001223e1:
              uVar12 = 4;
            }
          }
          else {
LAB_0012252f:
            uVar12 = 0;
            if (session->scpRecv_state == libssh2_NB_state_sent3) {
              sVar7 = _libssh2_channel_write(session->scpRecv_channel,0,puVar5,1);
              if ((int)sVar7 == 1) {
                uVar12 = 8;
              }
              else {
                uVar12 = 4;
                if ((int)sVar7 == -0x25) {
                  pcVar13 = "Would block waiting to send SCP ACK";
                  goto LAB_0012256e;
                }
              }
            }
          }
LAB_0012257f:
          switch(uVar12) {
          case 0:
          case 7:
            goto switchD_00122592_caseD_0;
          default:
            return (LIBSSH2_CHANNEL *)0x0;
          case 4:
            goto switchD_00122592_caseD_4;
          case 8:
            break;
          case 9:
            goto switchD_00122592_caseD_9;
          }
        }
      }
switchD_00122592_caseD_8:
      session->scpRecv_state = libssh2_NB_state_sent4;
    }
    if (session->scpRecv_state == libssh2_NB_state_sent4) {
      session->scpRecv_response_len = 0;
      session->scpRecv_state = libssh2_NB_state_sent5;
    }
    if ((session->scpRecv_state & ~libssh2_NB_state_allocated) == libssh2_NB_state_sent5) {
      uVar14 = session->scpRecv_response_len;
      if (uVar14 < 0x100) {
        puVar5 = session->scpRecv_response;
        puVar15 = session->scpRecv_response + 1;
        do {
          local_40 = (char *)0x0;
          if (session->scpRecv_state == libssh2_NB_state_sent5) {
            sVar7 = _libssh2_channel_read(session->scpRecv_channel,0,(char *)(puVar5 + uVar14),1);
            iVar2 = (int)sVar7;
            if (iVar2 == -0x25) {
              pcVar13 = "Would block waiting for SCP response";
LAB_00122898:
              _libssh2_error(session,-0x25,pcVar13);
              uVar11 = 1;
            }
            else {
              if (iVar2 < 0) {
                pcVar13 = "Failed reading SCP response";
              }
              else {
                if (iVar2 == 0) {
                  uVar11 = 9;
                  goto LAB_001228a9;
                }
                sVar16 = session->scpRecv_response_len;
                uVar14 = sVar16 + 1;
                session->scpRecv_response_len = uVar14;
                if (session->scpRecv_response[0] == 'C') {
                  if ((((uVar14 < 2) || (bVar1 = puVar5[sVar16], bVar1 == 10)) || (bVar1 == 0xd)) ||
                     (0x1f < bVar1)) {
                    if ((uVar14 < 7) || (puVar5[sVar16] != '\n')) {
                      uVar11 = 0x10;
                      if (uVar14 == 0x100) {
                        iVar2 = -0x1c;
                        pcVar13 = "Unterminated response from SCP server";
                        goto LAB_00122734;
                      }
                    }
                    else {
                      sVar16 = session->scpRecv_response_len;
                      while( true ) {
                        if ((session->scpRecv_response[sVar16 - 1] != '\r') &&
                           (session->scpRecv_response[sVar16 - 1] != '\n')) break;
                        session->scpRecv_response_len = sVar16 - 1;
                        sVar16 = sVar16 - 1;
                      }
                      session->scpRecv_response[sVar16] = '\0';
                      if (session->scpRecv_response_len < 6) {
                        iVar2 = -0x1c;
                        pcVar13 = "Invalid response from SCP server, too short";
                        goto LAB_00122734;
                      }
                      pcVar13 = strchr((char *)puVar15,0x20);
                      if (pcVar13 == (char *)0x0 || (long)pcVar13 - (long)puVar15 < 1) {
                        pcVar13 = "Invalid response from SCP server, malformed mode";
                      }
                      else {
                        *pcVar13 = '\0';
                        lVar8 = strtol((char *)puVar15,&local_40,8);
                        session->scpRecv_mode = lVar8;
                        if ((local_40 == (char *)0x0) || (*local_40 == '\0')) {
                          pcVar13 = pcVar13 + 1;
                          pcVar9 = strchr(pcVar13,0x20);
                          if ((pcVar9 == pcVar13 || (long)pcVar9 - (long)pcVar13 < 0) ||
                              pcVar9 == (char *)0x0) {
                            pcVar13 = "Invalid response from SCP server, too short or malformed";
                          }
                          else {
                            *pcVar9 = '\0';
                            lVar10 = strtoll(pcVar13,&local_40,10);
                            session->scpRecv_size = lVar10;
                            if ((local_40 == (char *)0x0) || (*local_40 == '\0')) {
                              session->scpRecv_response[0] = '\0';
                              session->scpRecv_state = libssh2_NB_state_sent6;
                              goto LAB_00122859;
                            }
                            pcVar13 = "Invalid response from SCP server, invalid size";
                          }
                        }
                        else {
                          pcVar13 = "Invalid response from SCP server, invalid mode";
                        }
                      }
                      _libssh2_error(session,-0x1c,pcVar13);
                      uVar11 = 4;
                    }
                    goto LAB_001228a9;
                  }
                  iVar2 = -0x1c;
                  pcVar13 = "Invalid data in SCP response";
                }
                else {
                  iVar2 = -0x1c;
                  pcVar13 = "Invalid response from SCP server";
                }
              }
LAB_00122734:
              _libssh2_error(session,iVar2,pcVar13);
              uVar11 = 4;
            }
          }
          else {
LAB_00122859:
            uVar11 = 0;
            if (session->scpRecv_state == libssh2_NB_state_sent6) {
              sVar7 = _libssh2_channel_write(session->scpRecv_channel,0,puVar5,1);
              if ((int)sVar7 == 1) {
                uVar11 = 0x11;
              }
              else {
                uVar11 = 4;
                if ((int)sVar7 == -0x25) {
                  pcVar13 = "Would block sending SCP ACK";
                  goto LAB_00122898;
                }
              }
            }
          }
LAB_001228a9:
          if (uVar11 < 9) {
            if (uVar11 != 0) {
              if (uVar11 != 4) {
                return (LIBSSH2_CHANNEL *)0x0;
              }
              goto switchD_00122592_caseD_4;
            }
          }
          else if (uVar11 != 0x10) {
            if (uVar11 == 9) goto switchD_00122592_caseD_9;
            if (uVar11 != 0x11) {
              return (LIBSSH2_CHANNEL *)0x0;
            }
            break;
          }
          uVar14 = session->scpRecv_response_len;
        } while (uVar14 < 0x100);
      }
      session->scpRecv_state = libssh2_NB_state_sent7;
    }
    if (sb != (libssh2_struct_stat *)0x0) {
      memset(sb,0,0x90);
      (sb->st_mtim).tv_sec = session->scpRecv_mtime;
      (sb->st_atim).tv_sec = session->scpRecv_atime;
      sb->st_size = session->scpRecv_size;
      sb->st_mode = (uint)(ushort)session->scpRecv_mode;
    }
    session->scpRecv_state = libssh2_NB_state_idle;
LAB_00122935:
    return session->scpRecv_channel;
  }
  pLVar6 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->scpRecv_channel = pLVar6;
  if (pLVar6 != (LIBSSH2_CHANNEL *)0x0) {
    session->scpRecv_state = libssh2_NB_state_sent;
    goto LAB_00122096;
  }
  iVar2 = libssh2_session_last_errno(session);
  if (iVar2 != -0x25) {
    (*session->free)(session->scpRecv_command,&session->abstract);
    session->scpRecv_command = (uchar *)0x0;
    goto LAB_001221d1;
  }
  pcVar13 = "Would block starting up channel";
LAB_0012215a:
  iVar2 = -0x25;
LAB_00122162:
  _libssh2_error(session,iVar2,pcVar13);
  return (LIBSSH2_CHANNEL *)0x0;
switchD_00122592_caseD_0:
  if (sb == (libssh2_struct_stat *)0x0) goto switchD_00122592_caseD_8;
  goto LAB_0012222e;
switchD_00122592_caseD_9:
  iVar2 = libssh2_channel_eof(session->scpRecv_channel);
  if (iVar2 == 0) goto LAB_00122935;
  _libssh2_error(session,-0x1c,"Unexpected channel close");
switchD_00122592_caseD_4:
  iVar2 = session->err_code;
  pcVar13 = session->err_msg;
  do {
    iVar3 = libssh2_channel_free(session->scpRecv_channel);
  } while (iVar3 == -0x25);
  session->err_code = iVar2;
  session->err_msg = pcVar13;
  session->scpRecv_channel = (LIBSSH2_CHANNEL *)0x0;
LAB_001221d1:
  session->scpRecv_state = libssh2_NB_state_idle;
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

static LIBSSH2_CHANNEL *
scp_recv(LIBSSH2_SESSION * session, const char *path, libssh2_struct_stat * sb)
{
    size_t cmd_len;
    int rc;
    int tmp_err_code;
    const char *tmp_err_msg;

    if(session->scpRecv_state == libssh2_NB_state_idle) {
        session->scpRecv_mode = 0;
        session->scpRecv_size = 0;
        session->scpRecv_mtime = 0;
        session->scpRecv_atime = 0;

        session->scpRecv_command_len =
            _libssh2_shell_quotedsize(path) + sizeof("scp -f ") + (sb ? 1 : 0);

        session->scpRecv_command =
            LIBSSH2_ALLOC(session, session->scpRecv_command_len);

        if(!session->scpRecv_command) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a command buffer for "
                           "SCP session");
            return NULL;
        }

        snprintf((char *)session->scpRecv_command,
                 session->scpRecv_command_len,
                 "scp -%sf ", sb ? "p" : "");

        cmd_len = strlen((char *)session->scpRecv_command);

        if(!session->flag.quote_paths) {
            size_t path_len;

            path_len = strlen(path);

            /* no NUL-termination needed, so memcpy will do */
            memcpy(&session->scpRecv_command[cmd_len], path, path_len);
            cmd_len += path_len;
        }
        else {
            cmd_len += shell_quotearg(path,
                                      &session->scpRecv_command[cmd_len],
                                      session->scpRecv_command_len - cmd_len);
        }

        /* the command to exec should _not_ be NUL-terminated */
        session->scpRecv_command_len = cmd_len;

        _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                       "Opening channel for SCP receive"));

        session->scpRecv_state = libssh2_NB_state_created;
    }

    if(session->scpRecv_state == libssh2_NB_state_created) {
        /* Allocate a channel */
        session->scpRecv_channel =
            _libssh2_channel_open(session, "session",
                                  sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL,
                                  0);
        if(!session->scpRecv_channel) {
            if(libssh2_session_last_errno(session) !=
                LIBSSH2_ERROR_EAGAIN) {
                LIBSSH2_FREE(session, session->scpRecv_command);
                session->scpRecv_command = NULL;
                session->scpRecv_state = libssh2_NB_state_idle;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block starting up channel");
            }
            return NULL;
        }

        session->scpRecv_state = libssh2_NB_state_sent;
    }

    if(session->scpRecv_state == libssh2_NB_state_sent) {
        /* Request SCP for the desired file */
        rc = _libssh2_channel_process_startup(session->scpRecv_channel, "exec",
                                              sizeof("exec") - 1,
                                              (char *)session->scpRecv_command,
                                              session->scpRecv_command_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting SCP startup");
            return NULL;
        }
        else if(rc) {
            LIBSSH2_FREE(session, session->scpRecv_command);
            session->scpRecv_command = NULL;
            goto scp_recv_error;
        }
        LIBSSH2_FREE(session, session->scpRecv_command);
        session->scpRecv_command = NULL;

        _libssh2_debug((session, LIBSSH2_TRACE_SCP, "Sending initial wakeup"));
        /* SCP ACK */
        session->scpRecv_response[0] = '\0';

        session->scpRecv_state = libssh2_NB_state_sent1;
    }

    if(session->scpRecv_state == libssh2_NB_state_sent1) {
        rc = (int)_libssh2_channel_write(session->scpRecv_channel, 0,
                                         session->scpRecv_response, 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending initial wakeup");
            return NULL;
        }
        else if(rc != 1) {
            goto scp_recv_error;
        }

        /* Parse SCP response */
        session->scpRecv_response_len = 0;

        session->scpRecv_state = libssh2_NB_state_sent2;
    }

    if((session->scpRecv_state == libssh2_NB_state_sent2)
        || (session->scpRecv_state == libssh2_NB_state_sent3)) {
        while(sb && (session->scpRecv_response_len <
                     LIBSSH2_SCP_RESPONSE_BUFLEN)) {
            unsigned char *s, *p;

            if(session->scpRecv_state == libssh2_NB_state_sent2) {
                rc = (int)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                (char *) session->
                                                scpRecv_response +
                                                session->scpRecv_response_len,
                                                1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting for SCP response");
                    return NULL;
                }
                else if(rc < 0) {
                    /* error, give up */
                    _libssh2_error(session, rc, "Failed reading SCP response");
                    goto scp_recv_error;
                }
                else if(rc == 0)
                    goto scp_recv_empty_channel;

                session->scpRecv_response_len++;

                if(session->scpRecv_response[0] != 'T') {
                    size_t err_len;
                    char *err_msg;

                    /* there can be
                       01 for warnings
                       02 for errors

                       The following string MUST be newline terminated
                    */
                    err_len =
                        _libssh2_channel_packet_data_len(session->
                                                         scpRecv_channel, 0);
                    err_msg = LIBSSH2_ALLOC(session, err_len + 1);
                    if(!err_msg) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Failed to get memory ");
                        goto scp_recv_error;
                    }

                    /* Read the remote error message */
                    (void)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                err_msg, err_len);
                    /* If it failed for any reason, we ignore it anyway. */

                    /* zero terminate the error */
                    err_msg[err_len] = 0;

                    _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                                   "got %02x %s", session->scpRecv_response[0],
                                   err_msg));

                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Failed to recv file");

                    LIBSSH2_FREE(session, err_msg);
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len > 1) &&
                    ((session->
                      scpRecv_response[session->scpRecv_response_len - 1] <
                      '0')
                     || (session->
                         scpRecv_response[session->scpRecv_response_len - 1] >
                         '9'))
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        ' ')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\r')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid data in SCP response");
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len < 9)
                    || (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    if(session->scpRecv_response_len ==
                        LIBSSH2_SCP_RESPONSE_BUFLEN) {
                        /* You had your chance */
                        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                       "Unterminated response from "
                                       "SCP server");
                        goto scp_recv_error;
                    }
                    /* Way too short to be an SCP response, or not done yet,
                       short circuit */
                    continue;
                }

                /* We're guaranteed not to go under response_len == 0 by the
                   logic above */
                while((session->
                        scpRecv_response[session->scpRecv_response_len - 1] ==
                        '\r')
                       || (session->
                           scpRecv_response[session->scpRecv_response_len -
                                            1] == '\n'))
                    session->scpRecv_response_len--;
                session->scpRecv_response[session->scpRecv_response_len] =
                    '\0';

                if(session->scpRecv_response_len < 8) {
                    /* EOL came too soon */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short");
                    goto scp_recv_error;
                }

                s = session->scpRecv_response + 1;

                p = (unsigned char *) strchr((char *) s, ' ');
                if(!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mtime");
                    goto scp_recv_error;
                }

                *(p++) = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_mtime = strtol((char *) s, NULL, 10);

                s = (unsigned char *) strchr((char *) p, ' ');
                if(!s || ((s - p) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mtime.usec");
                    goto scp_recv_error;
                }

                /* Ignore mtime.usec */
                s++;
                p = (unsigned char *) strchr((char *) s, ' ');
                if(!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short or malformed");
                    goto scp_recv_error;
                }

                *p = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_atime = strtol((char *) s, NULL, 10);

                /* SCP ACK */
                session->scpRecv_response[0] = '\0';

                session->scpRecv_state = libssh2_NB_state_sent3;
            }

            if(session->scpRecv_state == libssh2_NB_state_sent3) {
                rc = (int)_libssh2_channel_write(session->scpRecv_channel, 0,
                                                 session->scpRecv_response, 1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting to send SCP ACK");
                    return NULL;
                }
                else if(rc != 1) {
                    goto scp_recv_error;
                }

                _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                               "mtime = %ld, atime = %ld",
                               session->scpRecv_mtime,
                               session->scpRecv_atime));

                /* We *should* check that atime.usec is valid, but why let
                   that stop use? */
                break;
            }
        }

        session->scpRecv_state = libssh2_NB_state_sent4;
    }

    if(session->scpRecv_state == libssh2_NB_state_sent4) {
        session->scpRecv_response_len = 0;

        session->scpRecv_state = libssh2_NB_state_sent5;
    }

    if((session->scpRecv_state == libssh2_NB_state_sent5)
        || (session->scpRecv_state == libssh2_NB_state_sent6)) {
        while(session->scpRecv_response_len < LIBSSH2_SCP_RESPONSE_BUFLEN) {
            char *s, *p, *e = NULL;

            if(session->scpRecv_state == libssh2_NB_state_sent5) {
                rc = (int)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                (char *) session->
                                                scpRecv_response +
                                                session->scpRecv_response_len,
                                                1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting for SCP response");
                    return NULL;
                }
                else if(rc < 0) {
                    /* error, bail out */
                    _libssh2_error(session, rc, "Failed reading SCP response");
                    goto scp_recv_error;
                }
                else if(rc == 0)
                    goto scp_recv_empty_channel;

                session->scpRecv_response_len++;

                if(session->scpRecv_response[0] != 'C') {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server");
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len > 1) &&
                    (session->
                     scpRecv_response[session->scpRecv_response_len - 1] !=
                     '\r')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')
                    &&
                    (session->
                     scpRecv_response[session->scpRecv_response_len - 1]
                     < 32)) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid data in SCP response");
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len < 7)
                    || (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    if(session->scpRecv_response_len ==
                        LIBSSH2_SCP_RESPONSE_BUFLEN) {
                        /* You had your chance */
                        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                       "Unterminated response "
                                       "from SCP server");
                        goto scp_recv_error;
                    }
                    /* Way too short to be an SCP response, or not done yet,
                       short circuit */
                    continue;
                }

                /* We're guaranteed not to go under response_len == 0 by the
                   logic above */
                while((session->
                        scpRecv_response[session->scpRecv_response_len - 1] ==
                        '\r')
                       || (session->
                           scpRecv_response[session->scpRecv_response_len -
                                            1] == '\n')) {
                    session->scpRecv_response_len--;
                }
                session->scpRecv_response[session->scpRecv_response_len] =
                    '\0';

                if(session->scpRecv_response_len < 6) {
                    /* EOL came too soon */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short");
                    goto scp_recv_error;
                }

                s = (char *) session->scpRecv_response + 1;

                p = strchr(s, ' ');
                if(!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mode");
                    goto scp_recv_error;
                }

                *(p++) = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_mode = strtol(s, &e, 8);
                if(e && *e) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "invalid mode");
                    goto scp_recv_error;
                }

                s = strchr(p, ' ');
                if(!s || ((s - p) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short or malformed");
                    goto scp_recv_error;
                }

                *s = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_size = scpsize_strtol(p, &e, 10);
                if(e && *e) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "invalid size");
                    goto scp_recv_error;
                }

                /* SCP ACK */
                session->scpRecv_response[0] = '\0';

                session->scpRecv_state = libssh2_NB_state_sent6;
            }

            if(session->scpRecv_state == libssh2_NB_state_sent6) {
                rc = (int)_libssh2_channel_write(session->scpRecv_channel, 0,
                                                 session->scpRecv_response, 1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block sending SCP ACK");
                    return NULL;
                }
                else if(rc != 1) {
                    goto scp_recv_error;
                }
                _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                               "mode = 0%lo size = %ld", session->scpRecv_mode,
                               (long)session->scpRecv_size));

                /* We *should* check that basename is valid, but why let that
                   stop us? */
                break;
            }
        }

        session->scpRecv_state = libssh2_NB_state_sent7;
    }

    if(sb) {
        memset(sb, 0, sizeof(libssh2_struct_stat));

        sb->st_mtime = session->scpRecv_mtime;
        sb->st_atime = session->scpRecv_atime;
        sb->st_size = (libssh2_struct_stat_size)session->scpRecv_size;
        sb->st_mode = (unsigned short)session->scpRecv_mode;
    }

    session->scpRecv_state = libssh2_NB_state_idle;
    return session->scpRecv_channel;

scp_recv_empty_channel:
    /* the code only jumps here as a result of a zero read from channel_read()
       so we check EOF status to avoid getting stuck in a loop */
    if(libssh2_channel_eof(session->scpRecv_channel))
        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                       "Unexpected channel close");
    else
        return session->scpRecv_channel;
    /* fall-through */
scp_recv_error:
    tmp_err_code = session->err_code;
    tmp_err_msg = session->err_msg;
    while(libssh2_channel_free(session->scpRecv_channel) ==
           LIBSSH2_ERROR_EAGAIN);
    session->err_code = tmp_err_code;
    session->err_msg = tmp_err_msg;
    session->scpRecv_channel = NULL;
    session->scpRecv_state = libssh2_NB_state_idle;
    return NULL;
}